

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::visitIfStatement(CheckerVisitor *this,IfStatement *ifstmt)

{
  VarScope *this_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Statement *pSVar5;
  undefined4 extraout_var_01;
  CheckerVisitor *visitor;
  VarScope *in_RSI;
  CheckerVisitor *in_RDI;
  VarScope *unaff_retaddr;
  Expr *in_stack_00000008;
  CheckerVisitor *in_stack_00000010;
  bool isElseFT;
  bool isThenFT;
  VarScope *elseScope;
  VarScope *dummyScope;
  VarScope *thenScope;
  VarScope *trunkScope;
  value_type *in_stack_ffffffffffffff88;
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  *in_stack_ffffffffffffff90;
  VarScope *this_01;
  CheckerVisitor *in_stack_ffffffffffffff98;
  CheckerVisitor *in_stack_ffffffffffffffa0;
  VarScope *this_02;
  Expr *in_stack_ffffffffffffffa8;
  VarScope *stmt;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  byte bVar6;
  undefined1 in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  VarScope *this_03;
  VarScope *this_04;
  CheckerVisitor *elseScope_00;
  
  elseScope_00 = in_RDI;
  checkEmptyThenBody(in_stack_ffffffffffffffa0,(IfStatement *)in_stack_ffffffffffffff98);
  checkDuplicateIfConditions(in_stack_ffffffffffffffa0,(IfStatement *)in_stack_ffffffffffffff98);
  checkDuplicateIfBranches(in_stack_ffffffffffffffa0,(IfStatement *)in_stack_ffffffffffffff98);
  IfStatement::condition((IfStatement *)in_RSI);
  checkAlwaysTrueOrFalse(in_RDI,in_stack_ffffffffffffffa8);
  IfStatement::thenBranch((IfStatement *)in_RSI);
  checkSuspiciousFormatting
            ((CheckerVisitor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (Statement *)
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
             (Statement *)in_RDI);
  this_00 = in_RDI->currentScope;
  iVar2 = VarScope::copy(this_00,(EVP_PKEY_CTX *)in_RDI->arena,(EVP_PKEY_CTX *)0x0);
  iVar3 = VarScope::copy(this_00,(EVP_PKEY_CTX *)in_RDI->arena,(EVP_PKEY_CTX *)0x0);
  pSVar5 = IfStatement::elseBranch((IfStatement *)in_RSI);
  if (pSVar5 == (Statement *)0x0) {
    stmt = (VarScope *)0x0;
  }
  else {
    iVar4 = VarScope::copy(this_00,(EVP_PKEY_CTX *)in_RDI->arena,(EVP_PKEY_CTX *)0x0);
    stmt = (VarScope *)CONCAT44(extraout_var_01,iVar4);
  }
  this_03 = stmt;
  this_04 = in_RSI;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->currentScope = (VarScope *)CONCAT44(extraout_var_00,iVar3);
  IfStatement::condition((IfStatement *)this_04);
  Node::visit<SQCompilation::CheckerVisitor>
            ((Node *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_RDI->currentScope = this_00;
  visitor = (CheckerVisitor *)IfStatement::condition((IfStatement *)this_04);
  this_01 = this_00;
  if (this_03 != (VarScope *)0x0) {
    this_01 = this_03;
  }
  this_02 = (VarScope *)CONCAT44(extraout_var,iVar2);
  speculateIfConditionHeuristics
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(VarScope *)elseScope_00,
             SUB81((ulong)this_04 >> 0x38,0));
  in_RDI->currentScope = (VarScope *)CONCAT44(extraout_var,iVar2);
  IfStatement::thenBranch((IfStatement *)this_04);
  Node::visit<SQCompilation::CheckerVisitor>((Node *)this_02,visitor);
  IfStatement::thenBranch((IfStatement *)this_04);
  bVar1 = isFallThroughBranch((Statement *)stmt);
  bVar6 = 1;
  pSVar5 = IfStatement::elseBranch((IfStatement *)this_04);
  if (pSVar5 != (Statement *)0x0) {
    in_RDI->currentScope = this_03;
    IfStatement::elseBranch((IfStatement *)this_04);
    Node::visit<SQCompilation::CheckerVisitor>((Node *)this_02,visitor);
    IfStatement::elseBranch((IfStatement *)this_04);
    bVar6 = isFallThroughBranch((Statement *)stmt);
  }
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::pop_back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)0x1945b3);
  if (((bVar1 & 1) == 0) || ((bVar6 & 1) == 0)) {
    if ((bVar1 & 1) == 0) {
      if ((this_03 != (VarScope *)0x0) && ((bVar6 & 1) != 0)) {
        VarScope::copyFrom(this_03,in_RSI);
      }
    }
    else {
      VarScope::copyFrom(this_03,in_RSI);
    }
  }
  else if (this_03 == (VarScope *)0x0) {
    VarScope::merge(unaff_retaddr,(VarScope *)elseScope_00);
  }
  else {
    VarScope::merge(unaff_retaddr,(VarScope *)elseScope_00);
    VarScope::copyFrom(this_03,in_RSI);
  }
  if (this_03 != (VarScope *)0x0) {
    VarScope::~VarScope(this_01);
  }
  VarScope::~VarScope(this_01);
  in_RDI->currentScope = this_00;
  return;
}

Assistant:

void CheckerVisitor::visitIfStatement(IfStatement *ifstmt) {
  checkEmptyThenBody(ifstmt);
  checkDuplicateIfConditions(ifstmt);
  checkDuplicateIfBranches(ifstmt);
  checkAlwaysTrueOrFalse(ifstmt->condition());
  checkSuspiciousFormatting(ifstmt->thenBranch(), ifstmt);

  VarScope *trunkScope = currentScope;
  VarScope *thenScope = trunkScope->copy(arena);
  VarScope *dummyScope = trunkScope->copy(arena);
  VarScope *elseScope = ifstmt->elseBranch() ? trunkScope->copy(arena) : nullptr;

  nodeStack.push_back({ SST_NODE, ifstmt });

  currentScope = dummyScope;

  ifstmt->condition()->visit(this);

  currentScope = trunkScope;

  // pass fall-through branch to not lose effects
  speculateIfConditionHeuristics(ifstmt->condition(), thenScope, elseScope ? elseScope : trunkScope);

  currentScope = thenScope;

  ifstmt->thenBranch()->visit(this);

  bool isThenFT = isFallThroughBranch(ifstmt->thenBranch());
  bool isElseFT = true;

  if (ifstmt->elseBranch()) {
    currentScope = elseScope;
    ifstmt->elseBranch()->visit(this);
    isElseFT = isFallThroughBranch(ifstmt->elseBranch());
  }

  nodeStack.pop_back();

  if (isThenFT && isElseFT) {
    if (elseScope) {
      thenScope->merge(elseScope);
      trunkScope->copyFrom(thenScope);
    }
    else {
      trunkScope->merge(thenScope);
    }
  }
  else if (isThenFT) {
    trunkScope->copyFrom(thenScope);
  }
  else if (elseScope && isElseFT) {
    trunkScope->copyFrom(elseScope);
  }

  if (elseScope)
    elseScope->~VarScope();

  thenScope->~VarScope();
  currentScope = trunkScope;
}